

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.cpp
# Opt level: O0

void __thiscall ixy::IxgbeDevice::set_promisc(IxgbeDevice *this,bool enabled)

{
  undefined1 local_41;
  LogData<ixy::Pair<ixy::None,_const_char_*>_> local_40;
  undefined1 local_29;
  LogData<ixy::Pair<ixy::None,_const_char_*>_> local_28;
  undefined1 local_11;
  IxgbeDevice *pIStack_10;
  bool enabled_local;
  IxgbeDevice *this_local;
  
  local_11 = enabled;
  pIStack_10 = this;
  if (enabled) {
    memset(&local_29,0,1);
    local_28.list.second = (char *)ixy::operator<<("enabling promisc mode");
    info<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
               ,0x197,"set_promisc",&local_28);
    set_flags32(this,0x5080,0x300);
  }
  else {
    memset(&local_41,0,1);
    local_40.list.second = (char *)ixy::operator<<("disabling promisc mode");
    info<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
               ,0x19a,"set_promisc",&local_40);
    clear_flags32(this,0x5080,0x300);
  }
  return;
}

Assistant:

void IxgbeDevice::set_promisc(bool enabled) {
    if (enabled) {
        info("enabling promisc mode");
        set_flags32(IXGBE_FCTRL, IXGBE_FCTRL_MPE | IXGBE_FCTRL_UPE);
    } else {
        info("disabling promisc mode");
        clear_flags32(IXGBE_FCTRL, IXGBE_FCTRL_MPE | IXGBE_FCTRL_UPE);
    }
}